

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void ceilingFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  sqlite3_context *pCtx;
  sqlite3_context *in_RDI;
  _func_double_double *x;
  double in_stack_ffffffffffffffb8;
  sqlite3_value *in_stack_ffffffffffffffc0;
  
  iVar1 = sqlite3_value_numeric_type(in_stack_ffffffffffffffc0);
  if (iVar1 == 1) {
    sqlite3_value_int64((sqlite3_value *)0x226372);
    sqlite3_result_int64
              ((sqlite3_context *)in_stack_ffffffffffffffc0,(i64)in_stack_ffffffffffffffb8);
  }
  else if (iVar1 == 2) {
    pCtx = (sqlite3_context *)sqlite3_user_data(in_RDI);
    sqlite3_value_double((sqlite3_value *)0x2263b1);
    (*(code *)pCtx)();
    sqlite3_result_double(pCtx,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

static void ceilingFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  assert( argc==1 );
  switch( sqlite3_value_numeric_type(argv[0]) ){
    case SQLITE_INTEGER: {
       sqlite3_result_int64(context, sqlite3_value_int64(argv[0]));
       break;
    }
    case SQLITE_FLOAT: {
       double (*x)(double) = (double(*)(double))sqlite3_user_data(context);
       sqlite3_result_double(context, x(sqlite3_value_double(argv[0])));
       break;
    }
    default: {
       break;
    }
  }
}